

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O1

int AF_AActor_A_ResetHealth
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  player_t *ppVar1;
  APlayerPawn *pAVar2;
  PClass *pPVar3;
  int iVar4;
  undefined4 extraout_var;
  PClass *pPVar5;
  AActor *pAVar6;
  undefined4 extraout_var_00;
  char *pcVar7;
  bool bVar8;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar7 = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      pAVar6 = (AActor *)(param->field_0).field_1.a;
      if (pAVar6 != (AActor *)0x0) {
        if ((pAVar6->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar4 = (**(pAVar6->super_DThinker).super_DObject._vptr_DObject)(pAVar6);
          (pAVar6->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar4);
        }
        pPVar5 = (pAVar6->super_DThinker).super_DObject.Class;
        bVar8 = pPVar5 != (PClass *)0x0;
        if (pPVar5 != pPVar3 && bVar8) {
          do {
            pPVar5 = pPVar5->ParentClass;
            bVar8 = pPVar5 != (PClass *)0x0;
            if (pPVar5 == pPVar3) break;
          } while (pPVar5 != (PClass *)0x0);
        }
        if (!bVar8) {
          pcVar7 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003e0df8;
        }
      }
      if (numparam == 1) {
        param = defaultparam->Array;
        if (param[1].field_0.field_3.Type == '\0') {
LAB_003e0d5b:
          pAVar6 = COPY_AAPTR(pAVar6,param[1].field_0.i);
          if (pAVar6 != (AActor *)0x0) {
            ppVar1 = pAVar6->player;
            if ((ppVar1 == (player_t *)0x0) ||
               (pAVar2 = ppVar1->mo, (pAVar2->super_AActor).health < 1)) {
              if (0 < pAVar6->health) {
                iVar4 = AActor::SpawnHealth(pAVar6);
                pAVar6->health = iVar4;
              }
            }
            else {
              if ((pAVar2->super_AActor).super_DThinker.super_DObject.Class == (PClass *)0x0) {
                iVar4 = (**(pAVar2->super_AActor).super_DThinker.super_DObject._vptr_DObject)
                                  (pAVar2);
                (pAVar2->super_AActor).super_DThinker.super_DObject.Class =
                     (PClass *)CONCAT44(extraout_var_00,iVar4);
              }
              iVar4 = *(int *)(((pAVar2->super_AActor).super_DThinker.super_DObject.Class)->Defaults
                              + 0x1fc);
              (ppVar1->mo->super_AActor).health = iVar4;
              ppVar1->health = iVar4;
            }
          }
          return 0;
        }
        pcVar7 = "(defaultparam[paramnum]).Type == REGT_INT";
      }
      else {
        if (param[1].field_0.field_3.Type == '\0') goto LAB_003e0d5b;
        pcVar7 = "(param[paramnum]).Type == REGT_INT";
      }
      __assert_fail(pcVar7,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1922,
                    "int AF_AActor_A_ResetHealth(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pcVar7 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_003e0df8:
  __assert_fail(pcVar7,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x1921,
                "int AF_AActor_A_ResetHealth(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_ResetHealth)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT_DEF(ptr);

	AActor *mobj = COPY_AAPTR(self, ptr);

	if (!mobj)
	{
		return 0;
	}

	player_t *player = mobj->player;
	if (player && (player->mo->health > 0))
	{
		player->health = player->mo->health = player->mo->GetDefault()->health; //Copied from the resurrect cheat.
	}
	else if (mobj && (mobj->health > 0))
	{
		mobj->health = mobj->SpawnHealth();
	}
	return 0;
}